

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::modelDisplay(IMLE *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *in_RSI;
  FastLinearExpert *in_RDI;
  int i;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_00000228;
  ostream *in_stack_00000230;
  ostream *in_stack_ffffffffffffffd8;
  int local_14;
  
  poVar1 = std::operator<<(in_RSI,"-----------------------    Experts   ----");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_14 = 0;
      local_14 <
      *(int *)&(in_RDI->super_LinearExpert).Szz.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      local_14 = local_14 + 1) {
    poVar1 = std::operator<<(in_RSI,"------ #");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14 + 1);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
    operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
               &(in_RDI->super_LinearExpert).Sxz,(long)local_14);
    FastLinearExpert::modelDisplay(in_RDI,in_stack_ffffffffffffffd8);
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(in_RSI,"-----------------------    Common    ----");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"M= ");
  this_00 = (void *)std::ostream::operator<<
                              (poVar1,*(int *)&(in_RDI->super_LinearExpert).Szz.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_data);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Sigma= ");
  poVar1 = Eigen::operator<<(in_stack_00000230,in_stack_00000228);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Psi= ");
  poVar1 = Eigen::operator<<(in_stack_00000230,in_stack_00000228);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::modelDisplay(std::ostream &out) const
{
    out << "-----------------------    Experts   ----" << std::endl;
   for(int i = 0; i < M; i++)
    {
        out << "------ #" << i+1 << ":" << std::endl;
        experts[i].modelDisplay(out);
        out << std::endl;
    }

    out << "-----------------------    Common    ----" << std::endl;
    out << EXPAND( M ) << std::endl;
    out << EXPAND(Sigma) << std::endl;
    out << EXPAND(Psi) << std::endl;

}